

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::Step(Thread *this,Ptr *out_trap)

{
  RunResult RVar1;
  RefPtr<wabt::interp::DefinedFunc> local_30;
  
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            (&local_30,this->store_,
             (Ref)(this->frames_).
                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].func.index);
  RVar1 = StepInternal(this,out_trap);
  if (local_30.obj_ != (DefinedFunc *)0x0) {
    Store::DeleteRoot(local_30.store_,local_30.root_index_);
  }
  return RVar1;
}

Assistant:

RunResult Thread::Step(Trap::Ptr* out_trap) {
  DefinedFunc::Ptr func{store_, frames_.back().func};
  return StepInternal(out_trap);
}